

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

MethodHandle * __thiscall
jsonrpccxx::methodHandle<std::vector<Product,std::allocator<Product>>>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          function<std::vector<Product,_std::allocator<Product>_>_()> *method)

{
  function<std::vector<Product,_std::allocator<Product>_>_()> local_38;
  jsonrpccxx *local_18;
  function<std::vector<Product,_std::allocator<Product>_>_()> *method_local;
  
  local_18 = this;
  method_local = (function<std::vector<Product,_std::allocator<Product>_>_()> *)
                 __return_storage_ptr__;
  std::function<std::vector<Product,_std::allocator<Product>_>_()>::function
            (&local_38,(function<std::vector<Product,_std::allocator<Product>_>_()> *)this);
  createMethodHandle<std::vector<Product,_std::allocator<Product>_>_>
            (__return_storage_ptr__,&local_38);
  std::function<std::vector<Product,_std::allocator<Product>_>_()>::~function(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle methodHandle(std::function<ReturnType(ParamTypes...)> method) {
    return createMethodHandle(method, std::index_sequence_for<ParamTypes...>{});
  }